

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QListView::paintEvent(QListView *this,QPaintEvent *e)

{
  QWidget *pQVar1;
  uint uVar2;
  QFlagsStorage<QStyle::StateFlag> QVar3;
  bool bVar4;
  bool bVar5;
  State SVar6;
  Int IVar7;
  Flow FVar8;
  int iVar9;
  Int IVar10;
  int iVar11;
  QListViewPrivate *this_00;
  QStyleOption *pQVar12;
  int *piVar13;
  QModelIndex *pQVar14;
  ulong uVar15;
  QPaintEvent *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar16 [16];
  QRect QVar17;
  int r;
  int row;
  ColorGroup cg;
  int previousRow;
  bool alternateBase;
  bool enabled;
  State viewState;
  bool alternate;
  bool focus;
  QItemSelectionModel *selections;
  QAbstractItemModel *itemModel;
  QListViewPrivate *d;
  State oldState;
  const_iterator it;
  const_iterator end;
  int maxSize;
  State state;
  QModelIndex hover;
  QModelIndex current;
  QList<QModelIndex> toBeRendered;
  QStylePainter painter;
  QStyleOptionRubberBand opt;
  QStyleOptionViewItem option;
  undefined4 in_stack_fffffffffffffcf8;
  ItemFlag in_stack_fffffffffffffcfc;
  QListViewPrivate *in_stack_fffffffffffffd00;
  QWidget *in_stack_fffffffffffffd08;
  QWidget *in_stack_fffffffffffffd10;
  QStyleOption *in_stack_fffffffffffffd18;
  QListViewPrivate *in_stack_fffffffffffffd20;
  QListViewPrivate *in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd34;
  undefined4 in_stack_fffffffffffffd38;
  uint in_stack_fffffffffffffd3c;
  int local_29c;
  ColorGroup local_294;
  int local_290;
  undefined8 local_224;
  undefined8 local_21c;
  int local_210;
  int local_20c;
  undefined4 local_208;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_204;
  int local_200;
  int local_1fc;
  undefined1 local_1f8 [16];
  QModelIndex *local_1e8;
  const_iterator local_1e0;
  const_iterator local_1d8;
  QSize local_1cc;
  int local_1c4;
  QSize local_1c0;
  int local_1b8;
  QSize local_1b4;
  int local_1ac;
  QSize local_1a8;
  int local_1a0;
  int local_19c;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_198;
  Int local_194;
  QPersistentModelIndex local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  QRect local_160;
  undefined1 *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  undefined1 local_120 [16];
  undefined8 local_110;
  undefined8 local_108;
  undefined4 local_e0;
  undefined1 local_dc;
  undefined1 local_d8 [8];
  QFlagsStorage<QStyle::StateFlag> local_d0 [2];
  undefined1 local_c8 [192];
  QMetaObject *local_8;
  
  local_8 = *(QMetaObject **)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QListView *)0x87a5ce);
  bVar4 = ::QPointer::operator_cast_to_bool((QPointer<QAbstractItemDelegate> *)0x87a5ea);
  if (!bVar4) goto LAB_0087b08b;
  memset(local_d8,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)0x87a617);
  (**(code **)(*in_RDI + 0x2f8))(in_RDI,local_d8);
  local_138 = &DAT_aaaaaaaaaaaaaaaa;
  local_130 = &DAT_aaaaaaaaaaaaaaaa;
  local_128 = &DAT_aaaaaaaaaaaaaaaa;
  QStylePainter::QStylePainter((QStylePainter *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08)
  ;
  local_150 = &DAT_aaaaaaaaaaaaaaaa;
  local_148 = &DAT_aaaaaaaaaaaaaaaa;
  local_140 = &DAT_aaaaaaaaaaaaaaaa;
  QPaintEvent::rect(in_RSI);
  (**(code **)(*in_RDI + 0x2b0))();
  (**(code **)(*in_RDI + 0x2b8))();
  local_160 = QRect::translated((QRect *)CONCAT44(in_stack_fffffffffffffd3c,
                                                  in_stack_fffffffffffffd38),
                                in_stack_fffffffffffffd34,in_stack_fffffffffffffd30);
  QListViewPrivate::intersectingSet
            (in_stack_fffffffffffffd20,(QRect *)in_stack_fffffffffffffd18,
             SUB81((ulong)in_stack_fffffffffffffd10 >> 0x38,0));
  local_178 = &DAT_aaaaaaaaaaaaaaaa;
  local_170 = &DAT_aaaaaaaaaaaaaaaa;
  local_168 = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex((QAbstractItemView *)in_stack_fffffffffffffd10);
  local_190.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  local_188 = &DAT_aaaaaaaaaaaaaaaa;
  local_180 = &DAT_aaaaaaaaaaaaaaaa;
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_190);
  pQVar1 = (QWidget *)(this_00->super_QAbstractItemViewPrivate).model;
  pQVar12 = (QStyleOption *)
            ::QPointer::operator_cast_to_QItemSelectionModel_
                      ((QPointer<QItemSelectionModel> *)0x87a7d1);
  bVar4 = QWidget::hasFocus((QWidget *)in_stack_fffffffffffffd18);
  if (bVar4) {
LAB_0087a80a:
    bVar4 = QModelIndex::isValid((QModelIndex *)in_stack_fffffffffffffd00);
    in_stack_fffffffffffffd3c = CONCAT13(bVar4,(int3)in_stack_fffffffffffffd3c);
  }
  else {
    bVar4 = QWidget::hasFocus((QWidget *)in_stack_fffffffffffffd18);
    in_stack_fffffffffffffd3c = in_stack_fffffffffffffd3c & 0xffffff;
    if (bVar4) goto LAB_0087a80a;
  }
  uVar2 = in_stack_fffffffffffffd3c >> 0x18;
  bVar4 = (this_00->super_QAbstractItemViewPrivate).alternatingColors;
  local_194 = local_d0[0].i;
  SVar6 = QAbstractItemView::state((QAbstractItemView *)in_stack_fffffffffffffd00);
  local_198.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc);
  IVar7 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_198);
  local_290 = -2;
  FVar8 = flow((QListView *)in_stack_fffffffffffffd00);
  if (FVar8 == TopToBottom) {
    QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_fffffffffffffd00);
    local_1a8 = QWidget::size((QWidget *)
                              CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    local_1a0 = QSize::width((QSize *)0x87a8e4);
    local_1b4 = QListViewPrivate::contentsSize(in_stack_fffffffffffffd00);
    local_1ac = QSize::width((QSize *)0x87a90d);
    piVar13 = qMax<int>(&local_1a0,&local_1ac);
    in_stack_fffffffffffffd34 = *piVar13;
    iVar9 = QListViewPrivate::spacing(this_00);
    iVar9 = in_stack_fffffffffffffd34 + iVar9 * -2;
  }
  else {
    QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_fffffffffffffd00);
    local_1c0 = QWidget::size((QWidget *)
                              CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    local_1b8 = QSize::height((QSize *)0x87a976);
    local_1cc = QListViewPrivate::contentsSize(in_stack_fffffffffffffd00);
    local_1c4 = QSize::height((QSize *)0x87a99f);
    piVar13 = qMax<int>(&local_1b8,&local_1c4);
    in_stack_fffffffffffffd30 = *piVar13;
    iVar9 = QListViewPrivate::spacing(this_00);
    iVar9 = in_stack_fffffffffffffd30 + iVar9 * -2;
  }
  local_1d8.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_19c = iVar9;
  local_1d8 = QList<QModelIndex>::constEnd((QList<QModelIndex> *)in_stack_fffffffffffffd00);
  local_1e0.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_1e0 = QList<QModelIndex>::constBegin((QList<QModelIndex> *)in_stack_fffffffffffffd00);
  while( true ) {
    local_1e8 = local_1d8.i;
    bVar5 = QList<QModelIndex>::const_iterator::operator!=(&local_1e0,local_1d8);
    if (!bVar5) break;
    pQVar14 = QList<QModelIndex>::const_iterator::operator*(&local_1e0);
    auVar16 = (**(code **)(*in_RDI + 0x1e0))(in_RDI,pQVar14);
    local_1f8 = auVar16;
    local_c8._0_16_ = auVar16;
    FVar8 = flow((QListView *)in_stack_fffffffffffffd00);
    if (FVar8 == TopToBottom) {
      in_stack_fffffffffffffd28 = (QListViewPrivate *)local_c8;
      local_1fc = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8
                                                ));
      qMin<int>(&local_19c,&local_1fc);
      QRect::setWidth((QRect *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc);
    }
    else {
      in_stack_fffffffffffffd20 = (QListViewPrivate *)local_c8;
      local_200 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffcfc,
                                                  in_stack_fffffffffffffcf8));
      qMin<int>(&local_19c,&local_200);
      QRect::setHeight((QRect *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc);
    }
    local_d0[0].i = local_194;
    if (pQVar12 != (QStyleOption *)0x0) {
      in_stack_fffffffffffffd18 = pQVar12;
      QList<QModelIndex>::const_iterator::operator*(&local_1e0);
      uVar15 = QItemSelectionModel::isSelected((QModelIndex *)in_stack_fffffffffffffd18);
      if ((uVar15 & 1) != 0) {
        QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)local_d0,State_Selected);
      }
    }
    if (IVar7 != 0) {
      in_stack_fffffffffffffd10 = pQVar1;
      pQVar14 = QList<QModelIndex>::const_iterator::operator*(&local_1e0);
      local_208 = (**(code **)(*(long *)in_stack_fffffffffffffd10 + 0x138))
                            (in_stack_fffffffffffffd10,pQVar14);
      local_204.super_QFlagsStorage<Qt::ItemFlag>.i =
           (QFlagsStorage<Qt::ItemFlag>)
           QFlags<Qt::ItemFlag>::operator&
                     ((QFlags<Qt::ItemFlag> *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc);
      IVar10 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_204);
      if (IVar10 == 0) {
        QFlags<QStyle::StateFlag>::operator&=((QFlags<QStyle::StateFlag> *)local_d0,-2);
      }
      local_294 = (ColorGroup)(IVar10 == 0);
      QPalette::setCurrentColorGroup((QPalette *)(local_c8 + 0x18),local_294);
    }
    if ((char)uVar2 != '\0') {
      QList<QModelIndex>::const_iterator::operator*(&local_1e0);
      bVar5 = ::operator==((QModelIndex *)in_stack_fffffffffffffd00,
                           (QModelIndex *)
                           CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      if (bVar5) {
        QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)local_d0,State_HasFocus);
        if (SVar6 == EditingState) {
          QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)local_d0,State_Editing)
          ;
        }
      }
    }
    QList<QModelIndex>::const_iterator::operator*(&local_1e0);
    ::operator==((QModelIndex *)in_stack_fffffffffffffd00,
                 (QModelIndex *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    QFlags<QStyle::StateFlag>::setFlag
              ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffd20,
               (StateFlag)((ulong)in_stack_fffffffffffffd18 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffd18 >> 0x18,0));
    if ((bVar4 & 1U) != 0) {
      pQVar14 = QList<QModelIndex>::const_iterator::operator*(&local_1e0);
      iVar11 = QModelIndex::row(pQVar14);
      if (iVar11 != local_290 + 1) {
        bVar5 = QSet<QPersistentModelIndex>::isEmpty((QSet<QPersistentModelIndex> *)0x87ad4f);
        if (!bVar5) {
          local_20c = local_290 + 1;
          local_210 = 0;
          piVar13 = qMax<int>(&local_20c,&local_210);
          for (local_29c = *piVar13; local_29c < iVar11; local_29c = local_29c + 1) {
            QListViewPrivate::isHidden
                      (in_stack_fffffffffffffd28,(int)((ulong)in_stack_fffffffffffffd20 >> 0x20));
          }
        }
      }
      QFlags<QStyleOptionViewItem::ViewItemFeature>::setFlag
                ((QFlags<QStyleOptionViewItem::ViewItemFeature> *)in_stack_fffffffffffffd20,
                 (ViewItemFeature)((ulong)in_stack_fffffffffffffd18 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffd18 >> 0x18,0));
      QVar3.i = local_d0[0].i;
      QFlags<QStyle::StateFlag>::operator&=((QFlags<QStyle::StateFlag> *)local_d0,-0x8001);
      QStylePainter::drawPrimitive
                ((QStylePainter *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
                 (QStyleOption *)0x87ae42);
      local_290 = iVar11;
      local_d0[0].i = QVar3.i;
    }
    pQVar14 = QList<QModelIndex>::const_iterator::operator*(&local_1e0);
    in_stack_fffffffffffffd00 = (QListViewPrivate *)(**(code **)(*in_RDI + 0x208))(in_RDI,pQVar14);
    pQVar14 = QList<QModelIndex>::const_iterator::operator*(&local_1e0);
    (**(code **)(*(long *)&(in_stack_fffffffffffffd00->super_QAbstractItemViewPrivate).
                           super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate
                + 0x60))(in_stack_fffffffffffffd00,&local_138,local_d8,pQVar14);
    QList<QModelIndex>::const_iterator::operator++(&local_1e0);
  }
  (*this_00->commonListView->_vptr_QCommonListViewBase[0x14])(this_00->commonListView,&local_138);
  if ((this_00->showElasticBand & 1U) != 0) {
    bVar4 = QRect::isValid((QRect *)in_stack_fffffffffffffd00);
    if (bVar4) {
      memset(local_120,0xaa,0x48);
      QStyleOptionRubberBand::QStyleOptionRubberBand((QStyleOptionRubberBand *)0x87af3a);
      QStyleOption::initFrom(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
      local_e0 = 1;
      local_dc = 0;
      QListViewPrivate::mapToViewport
                (in_stack_fffffffffffffd28,(QRect *)in_stack_fffffffffffffd20,
                 SUB81((ulong)in_stack_fffffffffffffd18 >> 0x38,0));
      QWidget::rect((QWidget *)in_stack_fffffffffffffd18);
      QRect::adjusted((QRect *)CONCAT44(in_stack_fffffffffffffd3c,iVar9),in_stack_fffffffffffffd34,
                      in_stack_fffffffffffffd30,(int)((ulong)in_stack_fffffffffffffd28 >> 0x20),
                      (int)in_stack_fffffffffffffd28);
      QVar17 = QRect::intersected((QRect *)in_stack_fffffffffffffd00,
                                  (QRect *)CONCAT44(in_stack_fffffffffffffcfc,
                                                    in_stack_fffffffffffffcf8));
      local_224 = QVar17._0_8_;
      local_110 = local_224;
      local_21c = QVar17._8_8_;
      local_108 = local_21c;
      QPainter::save();
      QStylePainter::drawControl
                ((QStylePainter *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
                 (QStyleOption *)0x87b04a);
      QPainter::restore();
      QStyleOptionRubberBand::~QStyleOptionRubberBand((QStyleOptionRubberBand *)0x87b064);
    }
  }
  QList<QModelIndex>::~QList((QList<QModelIndex> *)0x87b071);
  QStylePainter::~QStylePainter((QStylePainter *)0x87b07e);
  QStyleOptionViewItem::~QStyleOptionViewItem((QStyleOptionViewItem *)in_stack_fffffffffffffd00);
LAB_0087b08b:
  if (*(QMetaObject **)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListView::paintEvent(QPaintEvent *e)
{
    Q_D(QListView);
    if (!d->itemDelegate)
        return;
    QStyleOptionViewItem option;
    initViewItemOption(&option);
    QStylePainter painter(d->viewport);

    const QList<QModelIndex> toBeRendered =
            d->intersectingSet(e->rect().translated(horizontalOffset(), verticalOffset()), false);

    const QModelIndex current = currentIndex();
    const QModelIndex hover = d->hover;
    const QAbstractItemModel *itemModel = d->model;
    const QItemSelectionModel *selections = d->selectionModel;
    const bool focus = (hasFocus() || d->viewport->hasFocus()) && current.isValid();
    const bool alternate = d->alternatingColors;
    const QStyle::State state = option.state;
    const QAbstractItemView::State viewState = this->state();
    const bool enabled = (state & QStyle::State_Enabled) != 0;

    bool alternateBase = false;
    int previousRow = -2; // trigger the alternateBase adjustment on first pass

    int maxSize = (flow() == TopToBottom)
        ? qMax(viewport()->size().width(), d->contentsSize().width()) - 2 * d->spacing()
        : qMax(viewport()->size().height(), d->contentsSize().height()) - 2 * d->spacing();

    QList<QModelIndex>::const_iterator end = toBeRendered.constEnd();
    for (QList<QModelIndex>::const_iterator it = toBeRendered.constBegin(); it != end; ++it) {
        Q_ASSERT((*it).isValid());
        option.rect = visualRect(*it);

        if (flow() == TopToBottom)
            option.rect.setWidth(qMin(maxSize, option.rect.width()));
        else
            option.rect.setHeight(qMin(maxSize, option.rect.height()));

        option.state = state;
        if (selections && selections->isSelected(*it))
            option.state |= QStyle::State_Selected;
        if (enabled) {
            QPalette::ColorGroup cg;
            if ((itemModel->flags(*it) & Qt::ItemIsEnabled) == 0) {
                option.state &= ~QStyle::State_Enabled;
                cg = QPalette::Disabled;
            } else {
                cg = QPalette::Normal;
            }
            option.palette.setCurrentColorGroup(cg);
        }
        if (focus && current == *it) {
            option.state |= QStyle::State_HasFocus;
            if (viewState == EditingState)
                option.state |= QStyle::State_Editing;
        }
        option.state.setFlag(QStyle::State_MouseOver, *it == hover);

        if (alternate) {
            int row = (*it).row();
            if (row != previousRow + 1) {
                // adjust alternateBase according to rows in the "gap"
                if (!d->hiddenRows.isEmpty()) {
                    for (int r = qMax(previousRow + 1, 0); r < row; ++r) {
                        if (!d->isHidden(r))
                            alternateBase = !alternateBase;
                    }
                } else {
                    alternateBase = (row & 1) != 0;
                }
            }
            option.features.setFlag(QStyleOptionViewItem::Alternate, alternateBase);

            // draw background of the item (only alternate row). rest of the background
            // is provided by the delegate
            QStyle::State oldState = option.state;
            option.state &= ~QStyle::State_Selected;
            painter.drawPrimitive(QStyle::PE_PanelItemViewRow, option);
            option.state = oldState;

            alternateBase = !alternateBase;
            previousRow = row;
        }

        itemDelegateForIndex(*it)->paint(&painter, option, *it);
    }

#if QT_CONFIG(draganddrop)
    d->commonListView->paintDragDrop(&painter);
#endif

#if QT_CONFIG(rubberband)
    // #### move this implementation into a dynamic class
    if (d->showElasticBand && d->elasticBand.isValid()) {
        QStyleOptionRubberBand opt;
        opt.initFrom(this);
        opt.shape = QRubberBand::Rectangle;
        opt.opaque = false;
        opt.rect = d->mapToViewport(d->elasticBand, false).intersected(
            d->viewport->rect().adjusted(-16, -16, 16, 16));
        painter.save();
        painter.drawControl(QStyle::CE_RubberBand, opt);
        painter.restore();
    }
#endif
}